

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeparser.cpp
# Opt level: O2

bool __thiscall QMakeParser::failOperator(QMakeParser *this,char *msg)

{
  storage_type *psVar1;
  QByteArrayView *this_00;
  long in_FS_OFFSET;
  bool bVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView local_b0;
  QByteArrayView local_a0;
  QByteArrayView local_90;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  char *msg_local;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = this->m_invert != 0;
  msg_local = msg;
  if (bVar2) {
    psVar1 = (storage_type *)
             QByteArrayView::lengthHelperCharArray("Unexpected NOT operator %1.",0x1c);
    QVar3.m_data = psVar1;
    QVar3.m_size = (qsizetype)&local_68;
    QString::fromLatin1(QVar3);
    QByteArrayView::QByteArrayView<const_char_*,_true>(&local_90,&msg_local);
    QVar4.m_data = (storage_type *)local_90.m_size;
    QVar4.m_size = (qsizetype)&local_80;
    QString::fromLatin1(QVar4);
    QString::arg<QString,_true>
              ((QString *)&local_50,(QString *)&local_68,(QString *)&local_80,0,(QChar)0x20);
    parseError(this,(QString *)&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    this->m_invert = 0;
  }
  if (this->m_operator == OrOperator) {
    psVar1 = (storage_type *)
             QByteArrayView::lengthHelperCharArray("Unexpected OR operator %1.",0x1b);
    QVar6.m_data = psVar1;
    QVar6.m_size = (qsizetype)&local_68;
    QString::fromLatin1(QVar6);
    this_00 = &local_b0;
  }
  else {
    if (this->m_operator != AndOperator) goto LAB_002064fb;
    psVar1 = (storage_type *)
             QByteArrayView::lengthHelperCharArray("Unexpected AND operator %1.",0x1c);
    QVar5.m_data = psVar1;
    QVar5.m_size = (qsizetype)&local_68;
    QString::fromLatin1(QVar5);
    this_00 = &local_a0;
  }
  QByteArrayView::QByteArrayView<const_char_*,_true>(this_00,&msg_local);
  QVar7.m_data = (storage_type *)this_00->m_size;
  QVar7.m_size = (qsizetype)&local_80;
  QString::fromLatin1(QVar7);
  QString::arg<QString,_true>
            ((QString *)&local_50,(QString *)&local_68,(QString *)&local_80,0,(QChar)0x20);
  parseError(this,(QString *)&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  this->m_operator = NoOperator;
  bVar2 = true;
LAB_002064fb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QMakeParser::failOperator(const char *msg)
{
    bool fail = false;
    if (m_invert) {
        parseError(fL1S("Unexpected NOT operator %1.").arg(fL1S(msg)));
        m_invert = 0;
        fail = true;
    }
    if (m_operator == AndOperator) {
        parseError(fL1S("Unexpected AND operator %1.").arg(fL1S(msg)));
        m_operator = NoOperator;
        fail = true;
    } else if (m_operator == OrOperator) {
        parseError(fL1S("Unexpected OR operator %1.").arg(fL1S(msg)));
        m_operator = NoOperator;
        fail = true;
    }
    return fail;
}